

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O3

void nhr_request_delete(nhr_request r)

{
  if (r->socket != -1) {
    close(r->socket);
    r->socket = -1;
  }
  nhr_string_delete_clean(&r->scheme);
  nhr_string_delete_clean(&r->host);
  nhr_string_delete_clean(&r->path);
  nhr_map_delete_clean(&r->http_headers);
  nhr_map_delete_clean(&r->parameters);
  nhr_mutex_delete(r->work_mutex);
  nhr_mutex_delete(r->command_mutex);
  nhr_response_delete(r->response);
  nhr_string_delete_clean(&r->boundary);
  nhr_free(r);
  return;
}

Assistant:

void nhr_request_delete(nhr_request r) {
	nhr_request_close(r);

	nhr_string_delete_clean(&r->scheme);
	nhr_string_delete_clean(&r->host);
	nhr_string_delete_clean(&r->path);

	nhr_map_delete_clean(&r->http_headers);
	nhr_map_delete_clean(&r->parameters);

	nhr_mutex_delete(r->work_mutex);
	nhr_mutex_delete(r->command_mutex);

	nhr_response_delete(r->response);

#if !defined(NHR_NO_POST)
#if !defined(NHR_NO_POST_DATA)
    nhr_string_delete_clean(&r->boundary);
#endif
#endif

	nhr_free(r);
}